

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O2

error<idx2::err_code> idx2::WriteVolume(FILE *Fp,volume *Vol,grid *Grid)

{
  size_t sVar1;
  undefined8 uVar2;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar3;
  grid_iterator<signed_char> It;
  grid_iterator<signed_char> EndIt;
  
  switch(Vol->Type) {
  case int8:
    End<signed_char>(&EndIt,Grid,Vol);
    Begin<signed_char>(&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,1,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<signed_char>::operator++(&It);
    }
    break;
  case uint8:
    End<unsigned_char>((grid_iterator<unsigned_char> *)&EndIt,Grid,Vol);
    Begin<unsigned_char>((grid_iterator<unsigned_char> *)&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,1,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<unsigned_char>::operator++((grid_iterator<unsigned_char> *)&It);
    }
    break;
  case int16:
    End<short>((grid_iterator<short> *)&EndIt,Grid,Vol);
    Begin<short>((grid_iterator<short> *)&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,2,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<short>::operator++((grid_iterator<short> *)&It);
    }
    break;
  case uint16:
    End<unsigned_short>((grid_iterator<unsigned_short> *)&EndIt,Grid,Vol);
    Begin<unsigned_short>((grid_iterator<unsigned_short> *)&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,2,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<unsigned_short>::operator++((grid_iterator<unsigned_short> *)&It);
    }
    break;
  case int32:
    End<int>((grid_iterator<int> *)&EndIt,Grid,Vol);
    Begin<int>((grid_iterator<int> *)&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,4,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<int>::operator++((grid_iterator<int> *)&It);
    }
    break;
  case uint32:
    End<unsigned_int>((grid_iterator<unsigned_int> *)&EndIt,Grid,Vol);
    Begin<unsigned_int>((grid_iterator<unsigned_int> *)&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,4,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<unsigned_int>::operator++((grid_iterator<unsigned_int> *)&It);
    }
    break;
  case int64:
    End<long>((grid_iterator<long> *)&EndIt,Grid,Vol);
    Begin<long>((grid_iterator<long> *)&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,8,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<long>::operator++((grid_iterator<long> *)&It);
    }
    break;
  case uint64:
    End<unsigned_long>((grid_iterator<unsigned_long> *)&EndIt,Grid,Vol);
    Begin<unsigned_long>((grid_iterator<unsigned_long> *)&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,8,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<unsigned_long>::operator++((grid_iterator<unsigned_long> *)&It);
    }
    break;
  case float32:
    End<float>((grid_iterator<float> *)&EndIt,Grid,Vol);
    Begin<float>((grid_iterator<float> *)&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,4,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<float>::operator++((grid_iterator<float> *)&It);
    }
    break;
  case float64:
    End<double>((grid_iterator<double> *)&EndIt,Grid,Vol);
    Begin<double>((grid_iterator<double> *)&It,Grid,Vol);
    while (It.Ptr != EndIt.Ptr) {
      sVar1 = fwrite(It.Ptr,8,1,(FILE *)Fp);
      if (sVar1 != 1) goto LAB_0017c4cd;
      grid_iterator<double>::operator++((grid_iterator<double> *)&It);
    }
  }
  *(char **)(*in_FS_OFFSET + -0x400) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x58;
  uVar2 = 0;
LAB_0017c500:
  eVar3.Code = (int)uVar2;
  eVar3.StackIdx = (char)((ulong)uVar2 >> 0x20);
  eVar3.StrGened = (bool)(char)((ulong)uVar2 >> 0x28);
  eVar3._14_2_ = (short)((ulong)uVar2 >> 0x30);
  eVar3.Msg = "";
  return eVar3;
LAB_0017c4cd:
  *(char **)(*in_FS_OFFSET + -0x400) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x58;
  uVar2 = 0xc;
  goto LAB_0017c500;
}

Assistant:

error<>
WriteVolume(FILE* Fp, const volume& Vol, const grid& Grid)
{
#define Body(type)                                                                                 \
  auto EndIt = End<type>(Grid, Vol);                                                               \
  for (auto It = Begin<type>(Grid, Vol); It != EndIt; ++It)                                        \
  {                                                                                                \
    if (fwrite(&(*It), sizeof(*It), 1, Fp) != 1)                                                   \
      return idx2_Error(err_code::FileWriteFailed);                                                \
  }
  idx2_DispatchOnType(Vol.Type) return idx2_Error(err_code::NoError);
#undef Body
}